

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O3

uint * Corrade::Containers::ArrayMallocAllocator<unsigned_int>::allocate(size_t capacity)

{
  size_t __size;
  size_t *psVar1;
  ostream *output;
  Debug *pDVar2;
  Error EStack_38;
  
  __size = capacity * 4 + 8;
  psVar1 = (size_t *)malloc(__size);
  if (psVar1 != (size_t *)0x0) {
    *psVar1 = __size;
    return (uint *)(psVar1 + 1);
  }
  output = Utility::Error::defaultOutput();
  Utility::Error::Error(&EStack_38,output,(Flags)0x0);
  pDVar2 = Utility::Debug::operator<<
                     (&EStack_38.super_Debug,"Containers::ArrayMallocAllocator: can\'t allocate");
  pDVar2 = Utility::Debug::operator<<(pDVar2,__size);
  Utility::Debug::operator<<(pDVar2,"bytes");
  Utility::Error::~Error(&EStack_38);
  abort();
}

Assistant:

static T* allocate(std::size_t capacity) {
        /* Compared to ArrayNewAllocator, here the capacity is stored in bytes
           so it's possible to "reinterpret" the array into a different type
           (as the deleter is a typeless std::free() in any case) */
        const std::size_t inBytes = capacity*sizeof(T) + AllocationOffset;
        char* const memory = static_cast<char*>(std::malloc(inBytes));
        CORRADE_ASSERT(memory,
            "Containers::ArrayMallocAllocator: can't allocate" << inBytes << "bytes", {});
        reinterpret_cast<std::size_t*>(memory)[0] = inBytes;
        return reinterpret_cast<T*>(memory + AllocationOffset);
    }